

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

_Bool sysbvm_weakValueDictionary_findAssociation
                (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
                sysbvm_tuple_t *outAssociation)

{
  intptr_t iVar1;
  _Bool _Var2;
  anon_struct_24_3_ad04a50d gcFrame;
  sysbvm_dictionary_t *local_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  sysbvm_dictionary_t **local_30;
  
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    local_50 = 0;
    local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_48._12_4_ = 0;
    local_38 = 3;
    local_60 = (sysbvm_dictionary_t *)dictionary;
    local_58 = key;
    local_30 = &local_60;
    sysbvm_stackFrame_pushRecord(&local_48);
    iVar1 = sysbvm_dictionary_scanFor(context,&local_60,&local_58);
    if (((iVar1 < 0) ||
        (local_50 = *(sysbvm_tuple_t *)(*(long *)(dictionary + 0x18) + 0x10 + iVar1 * 8),
        local_50 == 0)) || (*(long *)(local_50 + 0x18) == 0x4f)) {
      _Var2 = false;
    }
    else {
      *outAssociation = local_50;
      _Var2 = true;
    }
    sysbvm_stackFrame_popRecord(&local_48);
    return _Var2;
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_weakValueDictionary_findAssociation(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t *outAssociation)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return false;

    struct {
        sysbvm_weakValueDictionary_t *dictionary;
        sysbvm_tuple_t key;
        sysbvm_weakValueAssociation_t *association;
    } gcFrame = {
        .dictionary = (sysbvm_weakValueDictionary_t*)dictionary,
        .key = key
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    intptr_t elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
    if(elementIndex < 0)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return false;
    }

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    gcFrame.association = (sysbvm_weakValueAssociation_t*)storage->elements[elementIndex];
    if(!gcFrame.association || gcFrame.association->value == SYSBVM_TOMBSTONE_TUPLE)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return false;
    }

    *outAssociation = (sysbvm_tuple_t)gcFrame.association;
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return true;
}